

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mem.c
# Opt level: O1

int read_file(char *file,uint8_t **data,size_t *size)

{
  int iVar1;
  FILE *__stream;
  uint8_t *__ptr;
  size_t sVar2;
  stat info;
  stat sStack_b8;
  
  __stream = fopen(file,"rb");
  stat(file,&sStack_b8);
  __ptr = (uint8_t *)calloc(sStack_b8.st_size,1);
  *data = __ptr;
  sVar2 = fread(__ptr,1,sStack_b8.st_size,__stream);
  if (sVar2 == sStack_b8.st_size) {
    fclose(__stream);
    *size = sStack_b8.st_size;
    iVar1 = 0;
  }
  else {
    free(*data);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int read_file(const char *file, uint8_t **data, size_t *size)
{
	size_t tmp;
	struct stat info;
	FILE *f;

	f = fopen(file, "rb");
	stat(file, &info);
	*data = calloc(info.st_size, 1);
	tmp = fread(*data, 1, info.st_size, f);
	if (tmp != info.st_size) {
		free(*data);
		return -1;
	}

	fclose(f);
	*size = info.st_size;
	return 0;
}